

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O2

fio_str_info_s *
fiobj_data_pread(fio_str_info_s *__return_storage_ptr__,FIOBJ io,intptr_t start_at,uintptr_t length)

{
  size_t sVar1;
  int *piVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  uintptr_t uVar7;
  long lVar8;
  long __offset;
  size_t __nbytes;
  FIOBJ o;
  
  o = io;
  while ((o != 0 && (sVar1 = fiobj_type_is(o,(fiobj_type_enum)io), sVar1 != 0))) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    uVar3 = start_at >> 0x3f;
    if (*(int *)(o + 0x30) != -2) {
      if (*(int *)(o + 0x30) == -1) {
        uVar5 = *(ulong *)(o + 0x20);
        uVar6 = (uVar3 & uVar5) + start_at;
        uVar3 = 0;
        if (0 < (long)uVar6) {
          uVar3 = uVar6;
        }
        if (uVar5 <= uVar3) {
          uVar3 = uVar5;
        }
        uVar7 = uVar5 - uVar3;
        if (uVar3 + length <= uVar5) {
          uVar7 = length;
        }
        if (uVar7 == 0) goto LAB_0013a431;
        __return_storage_ptr__->capa = 0;
        __return_storage_ptr__->len = uVar7;
        pcVar4 = (char *)(uVar3 + *(long *)(o + 8));
      }
      else {
        uVar5 = fiobj_data_get_fd_size(o);
        lVar8 = (uVar3 & uVar5) + start_at;
        __offset = 0;
        if (0 < lVar8) {
          __offset = lVar8;
        }
        __nbytes = uVar5 - __offset;
        if (__offset + length <= uVar5) {
          __nbytes = length;
        }
        if (__nbytes == 0) {
          *(undefined8 *)(o + 0x18) = 0;
          fio_free(*(void **)(o + 8));
          *(undefined8 *)(o + 8) = 0;
          goto LAB_0013a431;
        }
        *(undefined8 *)(o + 0x20) = 0;
        *(undefined8 *)(o + 0x28) = 0;
        fiobj_data_pre_write(o,__nbytes + 1);
        sVar1 = pread(*(int *)(o + 0x30),*(void **)(o + 8),__nbytes,__offset);
        if ((long)sVar1 < 1) goto LAB_0013a431;
        *(undefined1 *)(*(long *)(o + 8) + sVar1) = 0;
        __return_storage_ptr__->capa = 0;
        __return_storage_ptr__->len = sVar1;
        pcVar4 = *(char **)(o + 8);
      }
      __return_storage_ptr__->data = pcVar4;
      return __return_storage_ptr__;
    }
    uVar5 = *(ulong *)(o + 0x20);
    start_at = (uVar3 & uVar5) + start_at;
    if (start_at < 1) {
      start_at = 0;
    }
    if (uVar5 <= (ulong)start_at) {
      start_at = uVar5;
    }
    if (uVar5 < start_at + length) {
      length = uVar5 - start_at;
    }
    if (length == 0) goto LAB_0013a431;
    o = *(FIOBJ *)(o + 0x10);
  }
  piVar2 = __errno_location();
  *piVar2 = 0xe;
LAB_0013a431:
  __return_storage_ptr__->capa = 0;
  __return_storage_ptr__->len = 0;
  __return_storage_ptr__->data = (char *)0x0;
  return __return_storage_ptr__;
}

Assistant:

fio_str_info_s fiobj_data_pread(FIOBJ io, intptr_t start_at, uintptr_t length) {
  if (!io || !FIOBJ_TYPE_IS(io, FIOBJ_T_DATA)) {
    errno = EFAULT;
    return (fio_str_info_s){
        .data = NULL,
        .len = 0,
    };
  }

  errno = 0;
  switch (obj2io(io)->fd) {
  case -1:
    return fiobj_data_pread_str(io, start_at, length);
    break;
  case -2:
    return fiobj_data_pread_slice(io, start_at, length);
    break;
  default:
    return fiobj_data_pread_file(io, start_at, length);
  }
}